

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TThreadsFactory.cpp
# Opt level: O2

TThreadsFactory * TThreadsFactory::GetInstance(bool destroyInstance)

{
  TThreadsFactory *pTVar1;
  
  if (GetInstance::gThisInstance == (TThreadsFactory *)0x0 && !destroyInstance) {
    pTVar1 = (TThreadsFactory *)operator_new(0x78);
    TThreadsFactory(pTVar1);
    GetInstance::gThisInstance = pTVar1;
  }
  pTVar1 = GetInstance::gThisInstance;
  if (destroyInstance) {
    if (GetInstance::gThisInstance != (TThreadsFactory *)0x0) {
      ~TThreadsFactory(GetInstance::gThisInstance);
    }
    operator_delete(pTVar1,0x78);
    GetInstance::gThisInstance = (TThreadsFactory *)0x0;
  }
  return GetInstance::gThisInstance;
}

Assistant:

TThreadsFactory * TThreadsFactory::GetInstance(bool destroyInstance)
{
    static TThreadsFactory * gThisInstance = 0;

    /* If we don't exist yet, start ourselves */
    if (gThisInstance == 0 && !destroyInstance)
        gThisInstance = new TThreadsFactory();

    /* If we're asked to delete the instance */
    if (destroyInstance)
    {
        delete gThisInstance;
        gThisInstance = 0;
    }

    /* Return the instance */
    return gThisInstance;
}